

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O2

Vec_Int_t *
Rnm_ManRefine(Rnm_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vMap,int fPropFanout,int fNewRefinement,
             int fVerbose)

{
  size_t __size;
  int *piVar1;
  int iVar2;
  abctime aVar3;
  long lVar4;
  Rnm_Obj_t *__ptr;
  abctime aVar5;
  Vec_Int_t *vSelect;
  abctime aVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_00;
  int v;
  long lVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  
  aVar3 = Abc_Clock();
  p->nCalls = p->nCalls + 1;
  p->pCex = pCex;
  p->vMap = vMap;
  p->fPropFanout = fPropFanout;
  p->fVerbose = fVerbose;
  Rnm_ManCollect(p);
  __ptr = p->pObjs;
  lVar4 = (long)vMap->nSize + (long)p->vObjs->nSize + 1;
  p->nObjsFrame = (int)lVar4;
  uVar9 = ((long)pCex->iFrame + 1) * lVar4;
  iVar2 = (int)uVar9;
  p->nObjs = iVar2;
  if (p->nObjsAlloc < iVar2) {
    p->nObjsAlloc = iVar2 + 10000;
    __size = uVar9 * 4 + 40000;
    if (__ptr == (Rnm_Obj_t *)0x0) {
      __ptr = (Rnm_Obj_t *)malloc(__size);
    }
    else {
      __ptr = (Rnm_Obj_t *)realloc(__ptr,__size);
      uVar9 = (ulong)(uint)p->nObjs;
    }
    p->pObjs = __ptr;
  }
  v = 0;
  memset(__ptr,0,(long)(int)uVar9 << 2);
  aVar5 = Abc_Clock();
  vSelect = Vec_IntAlloc(100);
  iVar2 = Rnm_ManSensitize(p);
  if (iVar2 != 0) {
    aVar6 = Abc_Clock();
    p->timeFwd = p->timeFwd + (aVar6 - aVar5);
    aVar5 = Abc_Clock();
    p->nVisited = 0;
    pGVar7 = Gia_ManPo(p->pGia,v);
    Rnm_ManJustify_rec(p,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff),pCex->iFrame,
                       vSelect);
    if (1 < (long)vSelect->nSize) {
      qsort(vSelect->pArray,(long)vSelect->nSize,4,Vec_IntSortCompare1);
      iVar2 = 1;
      for (lVar4 = 1; lVar4 < vSelect->nSize; lVar4 = lVar4 + 1) {
        piVar1 = vSelect->pArray;
        if (piVar1[lVar4] != piVar1[lVar4 + -1]) {
          lVar8 = (long)iVar2;
          iVar2 = iVar2 + 1;
          piVar1[lVar8] = piVar1[lVar4];
        }
      }
      vSelect->nSize = iVar2;
    }
    aVar6 = Abc_Clock();
    p->timeBwd = p->timeBwd + (aVar6 - aVar5);
  }
  aVar5 = Abc_Clock();
  Rnm_ManVerifyUsingTerSim(p->pGia,p->pCex,p->vMap,p->vObjs,vSelect);
  aVar6 = Abc_Clock();
  p->timeVer = p->timeVer + (aVar6 - aVar5);
  pVVar10 = vSelect;
  if (0 < vSelect->nSize) {
    if (fNewRefinement == 0) {
      p_00 = Rnm_ManFilterSelected(p,vSelect);
    }
    else {
      p_00 = Rnm_ManFilterSelectedNew(p,vSelect);
    }
    if (0 < p_00->nSize) {
      pVVar10 = p_00;
      p_00 = vSelect;
    }
    Vec_IntFree(p_00);
  }
  Rnm_ManCleanValues(p);
  aVar5 = Abc_Clock();
  p->timeTotal = p->timeTotal + (aVar5 - aVar3);
  p->nRefines = p->nRefines + pVVar10->nSize;
  return pVVar10;
}

Assistant:

Vec_Int_t * Rnm_ManRefine( Rnm_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vMap, int fPropFanout, int fNewRefinement, int fVerbose )
{
    int fVerify = 1;
    Vec_Int_t * vGoodPPis, * vNewPPis;
    abctime clk, clk2 = Abc_Clock();
    int RetValue;
    p->nCalls++;
//    Gia_ManCleanValue( p->pGia );
    // initialize
    p->pCex = pCex;
    p->vMap = vMap;
    p->fPropFanout = fPropFanout;
    p->fVerbose    = fVerbose;
    // collects used objects
    Rnm_ManCollect( p );
    // initialize datastructure
    p->nObjsFrame = 1 + Vec_IntSize(vMap) + Vec_IntSize(p->vObjs);
    p->nObjs = p->nObjsFrame * (pCex->iFrame + 1);
    if ( p->nObjs > p->nObjsAlloc )
        p->pObjs = ABC_REALLOC( Rnm_Obj_t, p->pObjs, (p->nObjsAlloc = p->nObjs + 10000) );
    memset( p->pObjs, 0, sizeof(Rnm_Obj_t) * p->nObjs );
    // propagate priorities
    clk = Abc_Clock();
    vGoodPPis = Vec_IntAlloc( 100 );
    if ( Rnm_ManSensitize( p ) ) // the CEX is not a true CEX
    {
        p->timeFwd += Abc_Clock() - clk;
        // select refinement
        clk = Abc_Clock();
        p->nVisited = 0;
        Rnm_ManJustify_rec( p, Gia_ObjFanin0(Gia_ManPo(p->pGia, 0)), pCex->iFrame, vGoodPPis );
        RetValue = Vec_IntUniqify( vGoodPPis );
//        assert( RetValue == 0 );
        p->timeBwd += Abc_Clock() - clk;
    }

    // verify (empty) refinement
    // (only works when post-processing is not applied)
    if ( fVerify )
    {
        clk = Abc_Clock();
        Rnm_ManVerifyUsingTerSim( p->pGia, p->pCex, p->vMap, p->vObjs, vGoodPPis );
        p->timeVer += Abc_Clock() - clk;
    }

    // at this point array vGoodPPis contains the set of important PPIs
    if ( Vec_IntSize(vGoodPPis) > 0 ) // spurious CEX resulting in a non-trivial refinement 
    {
        // filter selected set
        if ( !fNewRefinement )  // default 
            vNewPPis = Rnm_ManFilterSelected( p, vGoodPPis );
        else // this is enabled when &gla is called with -r (&gla -r)
            vNewPPis = Rnm_ManFilterSelectedNew( p, vGoodPPis );

        // replace the PPI array if necessary
        if ( Vec_IntSize(vNewPPis) > 0 ) // something to select, replace current refinement 
            Vec_IntFree( vGoodPPis ), vGoodPPis = vNewPPis;
        else // if there is nothing to select, do not change the current refinement array
            Vec_IntFree( vNewPPis );
    }

    // clean values
    // we cannot do this before, because we need to remember what objects
    // belong to the abstraction when we do Rnm_ManFilterSelected()
    Rnm_ManCleanValues( p );

//    Vec_IntReverseOrder( vGoodPPis );
    p->timeTotal += Abc_Clock() - clk2;
    p->nRefines += Vec_IntSize(vGoodPPis);
    return vGoodPPis;
}